

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O2

void pdqsort_detail::
     pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,
               anon_class_24_3_1824b316 comp,int bad_allowed,bool leftmost)

{
  HighsInt *pHVar1;
  int iVar2;
  HighsInt HVar3;
  HighsInt HVar4;
  anon_class_24_3_1824b316 comp_00;
  anon_class_24_3_1824b316 comp_01;
  anon_class_24_3_1824b316 comp_02;
  anon_class_24_3_1824b316 comp_03;
  anon_class_24_3_1824b316 comp_04;
  anon_class_24_3_1824b316 comp_05;
  anon_class_24_3_1824b316 comp_06;
  anon_class_24_3_1824b316 comp_07;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:86:13)>
  __comp;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_src_mip_HighsCutGeneration_cpp:86:13)>
  __comp_00;
  int *piVar5;
  bool bVar6;
  long lVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  ulong uVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  int *piVar11;
  long lVar12;
  ulong uVar13;
  HighsInt *pHVar14;
  _DistanceType __len;
  ulong uVar15;
  int local_88;
  anon_class_24_3_1824b316 local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  int *local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_40;
  long local_38;
  
  local_58._M_current = end._M_current + -1;
  local_40._M_current = end._M_current + -2;
  local_48._M_current = end._M_current + -3;
  local_88 = bad_allowed;
LAB_00294de5:
  do {
    lVar7 = (long)end._M_current - (long)begin._M_current;
    uVar15 = lVar7 >> 2;
    if ((long)uVar15 < 0x18) {
      if ((leftmost & 1U) == 0) {
        local_78.r = comp.r;
        local_78.this = comp.this;
        local_78.nodequeue = comp.nodequeue;
        if (begin._M_current != end._M_current) {
          while (pHVar14 = begin._M_current + 1, pHVar14 != end._M_current) {
            bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                              (&local_78,begin._M_current[1],*begin._M_current);
            begin._M_current = pHVar14;
            if (bVar6) {
              HVar3 = *pHVar14;
              do {
                pHVar1 = pHVar14 + -2;
                *pHVar14 = pHVar14[-1];
                pHVar14 = pHVar14 + -1;
                bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                                  (&local_78,HVar3,*pHVar1);
              } while (bVar6);
              *pHVar14 = HVar3;
            }
          }
        }
      }
      else {
        local_78.r = comp.r;
        local_78.this = comp.this;
        local_78.nodequeue = comp.nodequeue;
        if (begin._M_current != end._M_current) {
          lVar7 = 4;
          _Var8._M_current = begin._M_current;
          while (pHVar14 = _Var8._M_current + 1, pHVar14 != end._M_current) {
            bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                              (&local_78,_Var8._M_current[1],*_Var8._M_current);
            if (bVar6) {
              HVar3 = *pHVar14;
              lVar12 = lVar7;
              do {
                *(undefined4 *)((long)begin._M_current + lVar12) =
                     *(undefined4 *)((long)begin._M_current + lVar12 + -4);
                _Var8._M_current = begin._M_current;
                if (lVar12 == 4) goto LAB_0029537a;
                bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                                  (&local_78,HVar3,
                                   *(HighsInt *)((long)begin._M_current + lVar12 + -8));
                lVar12 = lVar12 + -4;
              } while (bVar6);
              _Var8._M_current = (HighsInt *)(lVar12 + (long)begin._M_current);
LAB_0029537a:
              *_Var8._M_current = HVar3;
            }
            lVar7 = lVar7 + 4;
            _Var8._M_current = pHVar14;
          }
        }
      }
      return;
    }
    uVar13 = uVar15 >> 1;
    _Var8._M_current = begin._M_current + uVar13;
    local_38 = lVar7;
    if (uVar15 < 0x81) {
      comp_04.nodequeue = comp.nodequeue;
      comp_04.this = comp.this;
      comp_04.r = comp.r;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (_Var8,begin,local_58,comp_04);
    }
    else {
      comp_00.nodequeue = comp.nodequeue;
      comp_00.this = comp.this;
      comp_00.r = comp.r;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                (begin,_Var8,local_58,comp_00);
      comp_01.nodequeue = comp.nodequeue;
      comp_01.this = comp.this;
      comp_01.r = comp.r;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 1),
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar13 - 1)),local_40,comp_01);
      _Var10._M_current = begin._M_current + uVar13 + 1;
      comp_02.nodequeue = comp.nodequeue;
      comp_02.this = comp.this;
      comp_02.r = comp.r;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + 2),_Var10,local_48,comp_02);
      comp_03.nodequeue = comp.nodequeue;
      comp_03.this = comp.this;
      comp_03.r = comp.r;
      sort3<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 (begin._M_current + (uVar13 - 1)),_Var8,_Var10,comp_03);
      iVar2 = *begin._M_current;
      *begin._M_current = _Var10._M_current[-1];
      _Var10._M_current[-1] = iVar2;
    }
    if (((leftmost & 1U) == 0) &&
       (bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (&comp,begin._M_current[-1],*begin._M_current), !bVar6)) {
      local_78.r = comp.r;
      local_78.this = comp.this;
      local_78.nodequeue = comp.nodequeue;
      HVar3 = *begin._M_current;
      lVar7 = 0;
      do {
        bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (&local_78,HVar3,*(HighsInt *)((long)end._M_current + lVar7 + -4));
        lVar7 = lVar7 + -4;
      } while (bVar6);
      pHVar14 = (HighsInt *)((long)end._M_current + lVar7);
      _Var8._M_current = begin._M_current;
      if (lVar7 == -4) {
        do {
          if (pHVar14 <= _Var8._M_current) break;
          pHVar1 = _Var8._M_current + 1;
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (&local_78,HVar3,*pHVar1);
        } while (!bVar6);
      }
      else {
        do {
          pHVar1 = _Var8._M_current + 1;
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (&local_78,HVar3,*pHVar1);
        } while (!bVar6);
      }
      while (_Var8._M_current < pHVar14) {
        HVar4 = *_Var8._M_current;
        *_Var8._M_current = *pHVar14;
        *pHVar14 = HVar4;
        do {
          pHVar1 = pHVar14 + -1;
          pHVar14 = pHVar14 + -1;
          bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (&local_78,HVar3,*pHVar1);
        } while (bVar6);
        do {
          pHVar1 = _Var8._M_current + 1;
          _Var8._M_current = _Var8._M_current + 1;
          bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                            (&local_78,HVar3,*pHVar1);
        } while (!bVar6);
      }
      *begin._M_current = *pHVar14;
      *pHVar14 = HVar3;
      begin._M_current = pHVar14 + 1;
      goto LAB_00294de5;
    }
    local_78.r = comp.r;
    local_78.this = comp.this;
    local_78.nodequeue = comp.nodequeue;
    HVar3 = *begin._M_current;
    lVar7 = 0;
    do {
      bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                        (&local_78,*(HighsInt *)((long)begin._M_current + lVar7 + 4),HVar3);
      lVar7 = lVar7 + 4;
    } while (bVar6);
    _Var8._M_current = lVar7 + begin._M_current;
    _Var10._M_current = end._M_current;
    piVar5 = _Var8._M_current;
    if (lVar7 == 4) {
      do {
        piVar11 = _Var10._M_current;
        if (_Var10._M_current <= _Var8._M_current) break;
        pHVar14 = _Var10._M_current + -1;
        _Var10._M_current = _Var10._M_current + -1;
        bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (&local_78,*pHVar14,HVar3);
        piVar11 = _Var10._M_current;
      } while (!bVar6);
    }
    else {
      do {
        pHVar14 = _Var10._M_current + -1;
        _Var10._M_current = _Var10._M_current + -1;
        bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (&local_78,*pHVar14,HVar3);
        piVar11 = _Var10._M_current;
      } while (!bVar6);
    }
    while (local_50 = piVar5, _Var8._M_current < _Var10._M_current) {
      iVar2 = *_Var8._M_current;
      *_Var8._M_current = *_Var10._M_current;
      *_Var10._M_current = iVar2;
      do {
        pHVar14 = _Var8._M_current + 1;
        _Var8._M_current = _Var8._M_current + 1;
        bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (&local_78,*pHVar14,HVar3);
      } while (bVar6);
      do {
        pHVar14 = _Var10._M_current + -1;
        _Var10._M_current = _Var10._M_current + -1;
        bVar6 = HighsCutGeneration::determineCover::anon_class_24_3_1824b316::operator()
                          (&local_78,*pHVar14,HVar3);
        piVar5 = local_50;
      } while (!bVar6);
    }
    _Var10._M_current = _Var8._M_current + -1;
    *begin._M_current = _Var8._M_current[-1];
    _Var8._M_current[-1] = HVar3;
    uVar9 = (long)_Var10._M_current - (long)begin._M_current >> 2;
    uVar13 = (long)end._M_current - (long)_Var8._M_current >> 2;
    if (((long)uVar9 < (long)(uVar15 >> 3)) || ((long)uVar13 < (long)(uVar15 >> 3))) {
      local_88 = local_88 + -1;
      if (local_88 == 0) {
        local_78.r = comp.r;
        local_78.this = comp.this;
        local_78.nodequeue = comp.nodequeue;
        uVar13 = uVar15 - 2 >> 1;
        do {
          __comp._M_comp.nodequeue = local_78.nodequeue;
          __comp._M_comp.this = local_78.this;
          __comp._M_comp.r = local_78.r;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__2>>
                    (begin,uVar13,uVar15,begin._M_current[uVar13],__comp);
          bVar6 = uVar13 != 0;
          uVar13 = uVar13 - 1;
        } while (bVar6);
        local_78.r = comp.r;
        local_78.this = comp.this;
        local_78.nodequeue = comp.nodequeue;
        lVar7 = local_38;
        while (_Var8._M_current = local_58._M_current, 4 < lVar7) {
          iVar2 = *local_58._M_current;
          *local_58._M_current = *begin._M_current;
          lVar7 = lVar7 + -4;
          __comp_00._M_comp.nodequeue = local_78.nodequeue;
          __comp_00._M_comp.this = local_78.this;
          __comp_00._M_comp.r = local_78.r;
          std::
          __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::determineCover(bool)::__2>>
                    (begin,0,lVar7 >> 2,iVar2,__comp_00);
          local_58._M_current = _Var8._M_current + -1;
        }
        return;
      }
      if (0x17 < (long)uVar9) {
        iVar2 = *begin._M_current;
        uVar15 = uVar9 & 0xfffffffffffffffc;
        *begin._M_current = *(begin._M_current + uVar15);
        *(begin._M_current + uVar15) = iVar2;
        iVar2 = _Var8._M_current[-2];
        _Var8._M_current[-2] = *(_Var8._M_current + (-4 - uVar15));
        *(_Var8._M_current + (-4 - uVar15)) = iVar2;
        if (0x80 < uVar9) {
          uVar9 = uVar9 >> 2;
          iVar2 = begin._M_current[1];
          begin._M_current[1] = begin._M_current[uVar9 + 1];
          begin._M_current[uVar9 + 1] = iVar2;
          iVar2 = begin._M_current[2];
          begin._M_current[2] = begin._M_current[uVar9 + 2];
          begin._M_current[uVar9 + 2] = iVar2;
          iVar2 = _Var8._M_current[-3];
          _Var8._M_current[-3] = _Var8._M_current[~uVar9 - 1];
          _Var8._M_current[~uVar9 - 1] = iVar2;
          iVar2 = _Var8._M_current[-4];
          _Var8._M_current[-4] = _Var8._M_current[-uVar9 + -3];
          _Var8._M_current[-uVar9 + -3] = iVar2;
        }
      }
      if (0x17 < (long)uVar13) {
        uVar15 = uVar13 & 0xfffffffffffffffc;
        iVar2 = *_Var8._M_current;
        *_Var8._M_current = *(_Var8._M_current + uVar15);
        *(_Var8._M_current + uVar15) = iVar2;
        iVar2 = end._M_current[-1];
        end._M_current[-1] = *(end._M_current - uVar15);
        *(end._M_current - uVar15) = iVar2;
        if (0x80 < uVar13) {
          uVar13 = uVar13 >> 2;
          iVar2 = _Var8._M_current[1];
          _Var8._M_current[1] = _Var8._M_current[uVar13 + 1];
          _Var8._M_current[uVar13 + 1] = iVar2;
          iVar2 = _Var8._M_current[2];
          _Var8._M_current[2] = _Var8._M_current[uVar13 + 2];
          _Var8._M_current[uVar13 + 2] = iVar2;
          iVar2 = end._M_current[-2];
          end._M_current[-2] = end._M_current[~uVar13];
          end._M_current[~uVar13] = iVar2;
          iVar2 = end._M_current[-3];
          end._M_current[-3] = end._M_current[-2 - uVar13];
          end._M_current[-2 - uVar13] = iVar2;
        }
      }
    }
    else if (((piVar11 <= local_50) &&
             (comp_05.nodequeue = comp.nodequeue, comp_05.this = comp.this, comp_05.r = comp.r,
             bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                               (begin,_Var10,comp_05), bVar6)) &&
            (comp_06.nodequeue = comp.nodequeue, comp_06.this = comp.this, comp_06.r = comp.r,
            bVar6 = partial_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2>
                              (_Var8,end,comp_06), bVar6)) {
      return;
    }
    comp_07.nodequeue = comp.nodequeue;
    comp_07.this = comp.this;
    comp_07.r = comp.r;
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsCutGeneration::determineCover(bool)::__2,false>
              (begin,_Var10,comp_07,local_88,(bool)(leftmost & 1));
    leftmost = false;
    begin._M_current = _Var8._M_current;
  } while( true );
}

Assistant:

inline void pdqsort_loop(Iter begin, Iter end, Compare comp, int bad_allowed, bool leftmost = true) {
        typedef typename std::iterator_traits<Iter>::difference_type diff_t;

        // Use a while loop for tail recursion elimination.
        while (true) {
            diff_t size = end - begin;

            // Insertion sort is faster for small arrays.
            if (size < insertion_sort_threshold) {
                if (leftmost) insertion_sort(begin, end, comp);
                else unguarded_insertion_sort(begin, end, comp);
                return;
            }

            // Choose pivot as median of 3 or pseudomedian of 9.
            diff_t s2 = size / 2;
            if (size > ninther_threshold) {
                sort3(begin, begin + s2, end - 1, comp);
                sort3(begin + 1, begin + (s2 - 1), end - 2, comp);
                sort3(begin + 2, begin + (s2 + 1), end - 3, comp);
                sort3(begin + (s2 - 1), begin + s2, begin + (s2 + 1), comp);
                std::iter_swap(begin, begin + s2);
            } else sort3(begin + s2, begin, end - 1, comp);

            // If *(begin - 1) is the end of the right partition of a previous partition operation
            // there is no element in [begin, end) that is smaller than *(begin - 1). Then if our
            // pivot compares equal to *(begin - 1) we change strategy, putting equal elements in
            // the left partition, greater elements in the right partition. We do not have to
            // recurse on the left partition, since it's sorted (all equal).
            if (!leftmost && !comp(*(begin - 1), *begin)) {
                begin = partition_left(begin, end, comp) + 1;
                continue;
            }

            // Partition and get results.
            std::pair<Iter, bool> part_result =
                Branchless ? partition_right_branchless(begin, end, comp)
                           : partition_right(begin, end, comp);
            Iter pivot_pos = part_result.first;
            bool already_partitioned = part_result.second;

            // Check for a highly unbalanced partition.
            diff_t l_size = pivot_pos - begin;
            diff_t r_size = end - (pivot_pos + 1);
            bool highly_unbalanced = l_size < size / 8 || r_size < size / 8;

            // If we got a highly unbalanced partition we shuffle elements to break many patterns.
            if (highly_unbalanced) {
                // If we had too many bad partitions, switch to heapsort to guarantee O(n log n).
                if (--bad_allowed == 0) {
                    std::make_heap(begin, end, comp);
                    std::sort_heap(begin, end, comp);
                    return;
                }

                if (l_size >= insertion_sort_threshold) {
                    std::iter_swap(begin,             begin + l_size / 4);
                    std::iter_swap(pivot_pos - 1, pivot_pos - l_size / 4);

                    if (l_size > ninther_threshold) {
                        std::iter_swap(begin + 1,         begin + (l_size / 4 + 1));
                        std::iter_swap(begin + 2,         begin + (l_size / 4 + 2));
                        std::iter_swap(pivot_pos - 2, pivot_pos - (l_size / 4 + 1));
                        std::iter_swap(pivot_pos - 3, pivot_pos - (l_size / 4 + 2));
                    }
                }
                
                if (r_size >= insertion_sort_threshold) {
                    std::iter_swap(pivot_pos + 1, pivot_pos + (1 + r_size / 4));
                    std::iter_swap(end - 1,                   end - r_size / 4);
                    
                    if (r_size > ninther_threshold) {
                        std::iter_swap(pivot_pos + 2, pivot_pos + (2 + r_size / 4));
                        std::iter_swap(pivot_pos + 3, pivot_pos + (3 + r_size / 4));
                        std::iter_swap(end - 2,             end - (1 + r_size / 4));
                        std::iter_swap(end - 3,             end - (2 + r_size / 4));
                    }
                }
            } else {
                // If we were decently balanced and we tried to sort an already partitioned
                // sequence try to use insertion sort.
                if (already_partitioned && partial_insertion_sort(begin, pivot_pos, comp)
                                        && partial_insertion_sort(pivot_pos + 1, end, comp)) return;
            }
                
            // Sort the left partition first using recursion and do tail recursion elimination for
            // the right-hand partition.
            pdqsort_loop<Iter, Compare, Branchless>(begin, pivot_pos, comp, bad_allowed, leftmost);
            begin = pivot_pos + 1;
            leftmost = false;
        }
    }